

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O0

int __thiscall ncnn::Exp::forward_inplace(Exp *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  float fVar1;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  int local_27c;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined4 local_260;
  long local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined8 local_238;
  long local_230;
  int local_224;
  int local_220;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  long local_1f0;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined8 local_1d0;
  long local_1c8;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  long *local_1a0;
  undefined1 local_18d;
  int local_18c;
  undefined8 *local_180;
  undefined1 local_175;
  int local_174;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_140;
  undefined8 *local_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_58;
  
  local_1ac = *(int *)((long)in_RSI + 0x2c);
  local_1b0 = (int)in_RSI[6];
  local_1b4 = (int)in_RSI[7];
  local_1b8 = local_1ac * local_1b0;
  local_1a0 = in_RSI;
  if ((*(float *)(in_RDI + 0xd0) != -1.0) || (NAN(*(float *)(in_RDI + 0xd0)))) {
    for (local_224 = 0; local_224 < local_1b4; local_224 = local_224 + 1) {
      local_180 = &local_278;
      local_bc = *(int *)((long)local_1a0 + 0x2c);
      local_c0 = (int)local_1a0[6];
      local_c4 = *(undefined4 *)((long)local_1a0 + 0x34);
      local_230 = *local_1a0 + local_1a0[8] * (long)local_224 * local_1a0[2];
      local_d8 = local_1a0[2];
      local_dc = (undefined4)local_1a0[3];
      local_e8 = local_1a0[4];
      local_b8 = &local_278;
      local_a8 = (long)local_bc * (long)local_c0 * local_d8;
      local_160 = &local_278;
      local_130 = &local_278;
      local_ac = 0x10;
      local_18c = local_224;
      local_18d = 1;
      local_278 = 0;
      local_268 = 0;
      local_260 = 0;
      local_250 = 0;
      local_24c = 0;
      local_248 = 0;
      local_244 = 0;
      local_240 = 0;
      local_238 = 0;
      local_270 = 0;
      local_d0 = local_230;
      local_78 = local_130;
      local_258 = local_e8;
      for (local_27c = 0; local_27c < local_1b8; local_27c = local_27c + 1) {
        fVar1 = powf(*(float *)(in_RDI + 0xd0),
                     *(float *)(in_RDI + 0xd8) +
                     *(float *)(local_230 + (long)local_27c * 4) * *(float *)(in_RDI + 0xd4));
        *(float *)(local_230 + (long)local_27c * 4) = fVar1;
      }
    }
  }
  else {
    for (local_1bc = 0; local_1bc < local_1b4; local_1bc = local_1bc + 1) {
      local_168 = &local_210;
      local_f4 = *(int *)((long)local_1a0 + 0x2c);
      local_f8 = (int)local_1a0[6];
      local_fc = *(undefined4 *)((long)local_1a0 + 0x34);
      local_1c8 = *local_1a0 + local_1a0[8] * (long)local_1bc * local_1a0[2];
      local_110 = local_1a0[2];
      local_114 = (undefined4)local_1a0[3];
      local_120 = local_1a0[4];
      local_f0 = &local_210;
      local_98 = (long)local_f4 * (long)local_f8 * local_110;
      local_158 = &local_210;
      local_140 = &local_210;
      local_9c = 0x10;
      local_174 = local_1bc;
      local_175 = 1;
      local_210 = 0;
      local_200 = 0;
      local_1f8 = 0;
      local_1e8 = 0;
      local_1e4 = 0;
      local_1e0 = 0;
      local_1dc = 0;
      local_1d8 = 0;
      local_1d0 = 0;
      local_208 = 0;
      local_108 = local_1c8;
      local_58 = local_140;
      local_1f0 = local_120;
      for (local_220 = 0; local_220 < local_1b8; local_220 = local_220 + 1) {
        fVar1 = expf(*(float *)(in_RDI + 0xd8) +
                     *(float *)(local_1c8 + (long)local_220 * 4) * *(float *)(in_RDI + 0xd4));
        *(float *)(local_1c8 + (long)local_220 * 4) = fVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Exp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = expf(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = powf(base, (shift + ptr[i] * scale));
            }
        }
    }

    return 0;
}